

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void declareVariable(void)

{
  int iVar1;
  Token name;
  _Bool _Var2;
  long lVar3;
  ulong uVar4;
  
  if (current->scopeDepth != 0) {
    uVar4 = (ulong)(uint)current->localCount;
    lVar3 = uVar4 * 0x20 + -8;
    for (; 0 < (int)uVar4; uVar4 = (ulong)((int)uVar4 - 1)) {
      iVar1 = *(int *)((long)&current->locals[0].name.type + lVar3);
      if ((iVar1 != -1) && (iVar1 < current->scopeDepth)) break;
      _Var2 = identifiersEqual(&parser.previous,(Token *)((long)current->locals + lVar3 + -0x18));
      if (_Var2) {
        error("Variable with this name already declared in this scope.");
      }
      lVar3 = lVar3 + -0x20;
    }
    name.start = parser.previous.start;
    name.type = parser.previous.type;
    name._4_4_ = parser.previous._4_4_;
    name.length = parser.previous.length;
    name.line = parser.previous.line;
    addLocal(name);
  }
  return;
}

Assistant:

static void declareVariable() {
    // Global variables are implicitly declared.
    if (current->scopeDepth == 0) {
        return;
    }

    Token *name = &parser.previous;

    /**
     * Current scope is on the end of array so we looking backwards
     * until we stop on the first element -> the global scope
     */
    for (int i = current->localCount - 1; i >= 0; i--) {
        Local *local = &current->locals[i];
        if (local->depth != -1 && local->depth < current->scopeDepth) {
            break;
        }

        //Check if this variable is declared in same scope twice
        if (identifiersEqual(name, &local->name)) {
            error("Variable with this name already declared in this scope.");
        }
    }
    addLocal(*name);
}